

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cxx
# Opt level: O2

void __thiscall vigra::BmpDecoderImpl::read_colormap(BmpDecoderImpl *this)

{
  void *pvVar1;
  undefined1 uVar2;
  byte bVar3;
  ulong uVar4;
  uint uVar5;
  uint i;
  uint uVar6;
  bool bVar7;
  
  bVar3 = (byte)(this->info_header).bit_count;
  void_vector_base::resize(&(this->map).super_void_vector_base,(ulong)(uint)(3 << (bVar3 & 0x1f)));
  this->grayscale = true;
  uVar5 = 0;
  uVar6 = 0;
  do {
    if (uVar6 >> (bVar3 & 0x1f) != 0) {
      return;
    }
    uVar2 = std::istream::get();
    *(undefined1 *)((long)(this->map).super_void_vector_base.m_data + (ulong)(uVar5 + 2)) = uVar2;
    uVar2 = std::istream::get();
    uVar4 = (ulong)(uVar5 + 1);
    *(undefined1 *)((long)(this->map).super_void_vector_base.m_data + uVar4) = uVar2;
    uVar2 = std::istream::get();
    *(undefined1 *)((long)(this->map).super_void_vector_base.m_data + (ulong)uVar5) = uVar2;
    std::istream::get();
    if (this->grayscale == true) {
      pvVar1 = (this->map).super_void_vector_base.m_data;
      bVar7 = *(char *)((long)pvVar1 + (ulong)uVar5) == *(char *)((long)pvVar1 + uVar4);
      this->grayscale = bVar7;
      if (!bVar7) goto LAB_00129750;
      bVar7 = *(char *)((long)pvVar1 + uVar4) == *(char *)((long)pvVar1 + (ulong)(uVar5 + 2));
    }
    else {
LAB_00129750:
      bVar7 = false;
    }
    this->grayscale = bVar7;
    uVar6 = uVar6 + 1;
    uVar5 = uVar5 + 3;
  } while( true );
}

Assistant:

void BmpDecoderImpl::read_colormap ()
{
    const unsigned int num_colors = 1 << info_header.bit_count;
    map.resize( 3 * num_colors );
    grayscale = true;
    for ( unsigned int i = 0; i < num_colors; ++i ) {
        map[ 3 * i + 2 ] = stream.get();
        map[ 3 * i + 1 ] = stream.get();
        map[ 3 * i     ] = stream.get();
        stream.get(); // skip unused byte
        grayscale = grayscale && ( map[ 3 * i ] == map[ 3 * i + 1 ] );
        grayscale = grayscale && ( map[ 3 * i + 1 ] == map[ 3 * i + 2 ] );
    }
}